

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O0

exr_result_t
internal_coding_fill_channel_info
          (exr_coding_channel_info_t **channels,int16_t *num_chans,
          exr_coding_channel_info_t *builtinextras,exr_chunk_info_t *cinfo,
          _internal_exr_context *pctxt,_internal_exr_part *part)

{
  int iVar1;
  int *piVar2;
  undefined1 uVar3;
  exr_result_t eVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  long in_RCX;
  void *in_RDX;
  undefined2 *in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  long in_R9;
  exr_coding_channel_info_t *decc;
  exr_attr_chlist_entry_t *curc;
  int c;
  exr_coding_channel_info_t *chanfill;
  exr_attr_chlist_t *chanlist;
  int chans;
  int local_54;
  void *local_50;
  
  piVar2 = *(int **)(*(long *)(in_R9 + 0x20) + 0x18);
  iVar1 = *piVar2;
  local_50 = in_RDX;
  if (5 < iVar1) {
    local_50 = (void *)(**(code **)(in_R8 + 0x58))((long)iVar1 * 0x30);
    if (local_50 == (void *)0x0) {
      eVar4 = (**(code **)(in_R8 + 0x38))(in_R8,1);
      return eVar4;
    }
    memset(local_50,0,(long)iVar1 * 0x30);
  }
  for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
    lVar6 = *(long *)(piVar2 + 2) + (long)local_54 * 0x20;
    puVar7 = (undefined8 *)((long)local_50 + (long)local_54 * 0x30);
    *puVar7 = *(undefined8 *)(lVar6 + 8);
    iVar5 = compute_sampled_lines
                      (*(int *)(in_RCX + 0xc),*(int *)(lVar6 + 0x1c),*(int *)(in_RCX + 8));
    *(int *)(puVar7 + 1) = iVar5;
    if (*(int *)(lVar6 + 0x18) < 2) {
      *(undefined4 *)((long)puVar7 + 0xc) = *(undefined4 *)(in_RCX + 0x10);
    }
    else {
      *(int *)((long)puVar7 + 0xc) = *(int *)(in_RCX + 0x10) / *(int *)(lVar6 + 0x18);
    }
    *(undefined4 *)(puVar7 + 2) = *(undefined4 *)(lVar6 + 0x18);
    *(undefined4 *)((long)puVar7 + 0x14) = *(undefined4 *)(lVar6 + 0x1c);
    *(undefined1 *)(puVar7 + 3) = *(undefined1 *)(lVar6 + 0x14);
    uVar3 = 4;
    if (*(int *)(lVar6 + 0x10) == 1) {
      uVar3 = 2;
    }
    *(undefined1 *)((long)puVar7 + 0x19) = uVar3;
    *(short *)((long)puVar7 + 0x1a) = (short)*(undefined4 *)(lVar6 + 0x10);
    *(short *)((long)puVar7 + 0x1c) = (short)*(char *)((long)puVar7 + 0x19);
    *(undefined2 *)((long)puVar7 + 0x1e) = *(undefined2 *)((long)puVar7 + 0x1a);
  }
  *in_RDI = local_50;
  *in_RSI = (short)iVar1;
  return 0;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

exr_result_t
internal_coding_fill_channel_info (
    exr_coding_channel_info_t**         channels,
    int16_t*                            num_chans,
    exr_coding_channel_info_t*          builtinextras,
    const exr_chunk_info_t*             cinfo,
    const struct _internal_exr_context* pctxt,
    const struct _internal_exr_part*    part)
{
    int                        chans;
    exr_attr_chlist_t*         chanlist;
    exr_coding_channel_info_t* chanfill;

    chanlist = part->channels->chlist;
    chans    = chanlist->num_channels;
    if (chans <= 5) { chanfill = builtinextras; }
    else
    {
        chanfill = (exr_coding_channel_info_t*) pctxt->alloc_fn (
            (size_t) (chans) * sizeof (exr_coding_channel_info_t));
        if (chanfill == NULL)
            return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);
        memset (
            chanfill, 0, (size_t) (chans) * sizeof (exr_coding_channel_info_t));
    }

    for (int c = 0; c < chans; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        exr_coding_channel_info_t*     decc = (chanfill + c);

        decc->channel_name = curc->name.str;

        decc->height = compute_sampled_lines (
            cinfo->height, curc->y_sampling, cinfo->start_y);

        if (curc->x_sampling > 1)
            decc->width = cinfo->width / curc->x_sampling;
        else
            decc->width = cinfo->width;

        decc->x_samples         = curc->x_sampling;
        decc->y_samples         = curc->y_sampling;
        decc->p_linear          = curc->p_linear;
        decc->bytes_per_element = (curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4;
        decc->data_type         = (uint16_t) (curc->pixel_type);

        /* initialize these so they don't trip us up during decoding
         * when the user also chooses to skip a channel */
        decc->user_bytes_per_element = decc->bytes_per_element;
        decc->user_data_type         = decc->data_type;
        /* but leave the rest as zero for the user to fill in */
    }

    *channels  = chanfill;
    *num_chans = (int16_t) chans;

    return EXR_ERR_SUCCESS;
}